

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<std::complex<double>_>::Subst_Backward
          (TPZMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *B)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int iVar3;
  long lVar4;
  int64_t c;
  long lVar5;
  long lVar6;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double in_XMM1_Qa;
  undefined1 local_78 [16];
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  complex<double> pivot;
  
  lVar1 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  iVar3 = 0;
  if ((lVar1 == CONCAT44(extraout_var,iVar2)) && ((this->super_TPZBaseMatrix).fDecomposed == '\x03')
     ) {
    iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    lVar1 = CONCAT44(extraout_var_00,iVar2);
    while (lVar4 = lVar1, 0 < lVar4) {
      lVar1 = lVar4 + -1;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar1,lVar1);
      pivot._M_value._8_8_ = in_XMM1_Qa;
      for (lVar5 = 0; lVar5 < (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
          lVar5 = lVar5 + 1) {
        iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
        lVar6 = CONCAT44(extraout_var_01,iVar2);
        local_58 = 0.0;
        dStack_50 = 0.0;
        while (lVar4 < lVar6) {
          lVar6 = lVar6 + -1;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar1,lVar6);
          local_78._8_8_ = in_XMM1_Qa;
          (*(B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(B,lVar6,lVar5);
          local_68 = extraout_XMM0_Qa;
          dStack_60 = in_XMM1_Qa;
          std::operator*((complex<double> *)local_78,(complex<double> *)&local_68);
          local_58 = local_58 + extraout_XMM0_Qa_00;
          dStack_50 = dStack_50 + in_XMM1_Qa;
          in_XMM1_Qa = local_58;
        }
        (*(B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x24])(B,lVar1,lVar5);
        local_68 = extraout_XMM0_Qa_01 - local_58;
        dStack_60 = in_XMM1_Qa - dStack_50;
        std::operator/((complex<double> *)&local_68,&pivot);
        local_78._8_8_ = in_XMM1_Qa;
        (*(B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x23])(B,lVar1,lVar5,local_78);
      }
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int TPZMatrix<TVar>::Subst_Backward( TPZFMatrix<TVar> *B ) const {
	
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky) return( 0 );
	for ( int64_t r = Dim()-1;  r >= 0;  r-- ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = N, ..., r+1.
			//
			TVar sum = 0.0;
			for ( int64_t i = Dim()-1; i > r; i-- ) sum += GetVal(r, i) * B->GetVal(i, c);
            // Faz B[r,c] = (B[r,c] - sum) / A[r,r].
            //
            B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
        }
    }
    return( 1 );
}